

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.hpp
# Opt level: O0

void __thiscall
function<void_(int)>::function(function<void_(int)> *this,function<void_(int)> *other)

{
  function<void_(int)> *other_local;
  function<void_(int)> *this_local;
  
  this->vtable_ = (vtable *)0x0;
  this->vtable_ = other->vtable_;
  if (this->vtable_ != (vtable *)0x0) {
    (*this->vtable_->move)(other,this);
  }
  reset(other);
  return;
}

Assistant:

function<R(Args...)>::function (function && other) noexcept
{
	vtable_ = other.vtable_;
	if (vtable_)
		vtable_->move(&other.storage_, &storage_);
	other.reset();
}